

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

char * config_find_string_fallback(map *config_map,char *key,char *fallback)

{
  map_entry *pmVar1;
  int *piVar2;
  
  pmVar1 = map_get(config_map,key);
  if (pmVar1 == (map_entry *)0x0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)pmVar1->value;
  }
  if ((piVar2 != (int *)0x0) && (*piVar2 == 3)) {
    fallback = *(char **)(piVar2 + 2);
  }
  return fallback;
}

Assistant:

const char *config_find_string_fallback(const struct map *config_map, const char *key,
                                        const char *fallback)
{
        const char *string = NULL;

        if (config_find_string(config_map, key, &string) != NO_ERROR) {
                return fallback;
        }

        return string;
}